

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::UnblindTransaction
          (ElementsTransactionApi *this,string *tx_hex,
          vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_>
          *txout_unblind_keys,
          vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_>
          *issuance_blind_keys,
          vector<cfd::api::UnblindOutputs,_std::allocator<cfd::api::UnblindOutputs>_> *blind_outputs
          ,vector<cfd::api::UnblindIssuanceOutputs,_std::allocator<cfd::api::UnblindIssuanceOutputs>_>
           *issuance_outputs)

{
  bool bVar1;
  byte bVar2;
  value_type *__x;
  reference pvVar3;
  size_type sVar4;
  undefined8 in_RCX;
  UnblindParameter *in_RDI;
  undefined8 in_R8;
  long in_R9;
  long in_stack_00000008;
  UnblindIssuanceOutputs output_1;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> issuance_param;
  uint32_t txin_index;
  IssuanceBlindKeys *issuance;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_> *__range3_1;
  UnblindOutputs output;
  Privkey_conflict blinding_key;
  TxOutUnblindKeys *txout;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_> *__range3;
  UnblindParameter unblind_param;
  ConfidentialTransactionController *ctxc;
  UnblindParameter *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  uint32_t in_stack_fffffffffffffc54;
  value_type *in_stack_fffffffffffffc58;
  undefined7 in_stack_fffffffffffffc60;
  byte in_stack_fffffffffffffc67;
  UnblindParameter *this_00;
  UnblindIssuanceOutputs *in_stack_fffffffffffffc80;
  Privkey *in_stack_fffffffffffffca0;
  Privkey *in_stack_fffffffffffffca8;
  uint32_t in_stack_fffffffffffffcb4;
  ConfidentialTransactionController *in_stack_fffffffffffffcb8;
  ConfidentialValue local_338;
  ConfidentialAssetId local_310;
  ConfidentialValue local_2e8;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> local_2c0;
  Txid local_2a8;
  uint32_t local_284;
  reference local_280;
  IssuanceBlindKeys *local_278;
  __normal_iterator<const_cfd::api::IssuanceBlindKeys_*,_std::vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_>_>
  local_270;
  undefined8 local_268;
  uint32_t local_260;
  ConfidentialAssetId local_258;
  BlindFactor local_230;
  BlindFactor local_210;
  ConfidentialValue local_1f0;
  string local_1c8 [6];
  reference local_f8;
  TxOutUnblindKeys *local_f0;
  __normal_iterator<const_cfd::api::TxOutUnblindKeys_*,_std::vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_>_>
  local_e8;
  undefined8 local_e0;
  ConfidentialAssetId local_c8;
  BlindFactor local_a0;
  BlindFactor local_80;
  ConfidentialValue local_60;
  undefined1 local_31;
  long local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_31 = 0;
  this_00 = in_RDI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  ConfidentialTransactionController::ConfidentialTransactionController
            ((ConfidentialTransactionController *)
             CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
             (string *)in_stack_fffffffffffffc58);
  bVar1 = std::vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_>::
          empty((vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_> *)
                CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
  if ((!bVar1) && (local_30 != 0)) {
    core::UnblindParameter::UnblindParameter(this_00);
    local_e0 = local_20;
    local_e8._M_current =
         (TxOutUnblindKeys *)
         std::vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_>::begin
                   ((vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_>
                     *)in_stack_fffffffffffffc48);
    local_f0 = (TxOutUnblindKeys *)
               std::vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_>
               ::end((vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_>
                      *)in_stack_fffffffffffffc48);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::api::TxOutUnblindKeys_*,_std::vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                              (__normal_iterator<const_cfd::api::TxOutUnblindKeys_*,_std::vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_>_>
                               *)in_stack_fffffffffffffc48), bVar1) {
      local_f8 = __gnu_cxx::
                 __normal_iterator<const_cfd::api::TxOutUnblindKeys_*,_std::vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_>_>
                 ::operator*(&local_e8);
      core::Privkey::Privkey
                ((Privkey *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (Privkey *)in_stack_fffffffffffffc48);
      ConfidentialTransactionController::UnblindTxOut
                ((ConfidentialTransactionController *)in_stack_fffffffffffffc58,
                 in_stack_fffffffffffffc54,(Privkey *)in_stack_fffffffffffffc48);
      core::UnblindParameter::operator=
                ((UnblindParameter *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 in_stack_fffffffffffffc48);
      core::UnblindParameter::~UnblindParameter
                ((UnblindParameter *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      core::ConfidentialAssetId::GetHex_abi_cxx11_(local_1c8,&local_c8);
      bVar2 = std::__cxx11::string::empty();
      in_stack_fffffffffffffc67 = bVar2 ^ 0xff;
      std::__cxx11::string::~string((string *)local_1c8);
      if ((in_stack_fffffffffffffc67 & 1) != 0) {
        UnblindOutputs::UnblindOutputs((UnblindOutputs *)0x561ec7);
        local_260 = local_f8->index;
        core::ConfidentialAssetId::operator=(&local_258,&local_c8);
        core::BlindFactor::operator=(&local_210,&local_80);
        core::BlindFactor::operator=(&local_230,&local_a0);
        core::ConfidentialValue::operator=(&local_1f0,&local_60);
        std::vector<cfd::api::UnblindOutputs,_std::allocator<cfd::api::UnblindOutputs>_>::push_back
                  ((vector<cfd::api::UnblindOutputs,_std::allocator<cfd::api::UnblindOutputs>_> *)
                   CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                   in_stack_fffffffffffffc58);
        UnblindOutputs::~UnblindOutputs((UnblindOutputs *)0x561f5a);
      }
      core::Privkey::~Privkey((Privkey *)0x561ffa);
      __gnu_cxx::
      __normal_iterator<const_cfd::api::TxOutUnblindKeys_*,_std::vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_>_>
      ::operator++(&local_e8);
    }
    core::UnblindParameter::~UnblindParameter
              ((UnblindParameter *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  }
  bVar1 = std::vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_>::
          empty((vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_> *
                )CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
  if ((!bVar1) && (in_stack_00000008 != 0)) {
    local_268 = local_28;
    local_270._M_current =
         (IssuanceBlindKeys *)
         std::vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_>::
         begin((vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_> *)
               in_stack_fffffffffffffc48);
    local_278 = (IssuanceBlindKeys *)
                std::
                vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_>::
                end((vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_>
                     *)in_stack_fffffffffffffc48);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::api::IssuanceBlindKeys_*,_std::vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                              (__normal_iterator<const_cfd::api::IssuanceBlindKeys_*,_std::vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_>_>
                               *)in_stack_fffffffffffffc48), bVar1) {
      local_280 = __gnu_cxx::
                  __normal_iterator<const_cfd::api::IssuanceBlindKeys_*,_std::vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_>_>
                  ::operator*(&local_270);
      __x = (value_type *)
            ConfidentialTransactionController::GetTransaction
                      ((ConfidentialTransactionController *)in_RDI);
      core::Txid::Txid(&local_2a8,&local_280->txid);
      in_stack_fffffffffffffc54 =
           (*(__x->txid)._vptr_Txid[2])(__x,&local_2a8,(ulong)local_280->vout);
      core::Txid::~Txid((Txid *)0x562129);
      local_284 = in_stack_fffffffffffffc54;
      ConfidentialTransactionController::UnblindIssuance
                (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,in_stack_fffffffffffffca8,
                 in_stack_fffffffffffffca0);
      UnblindIssuanceOutputs::UnblindIssuanceOutputs(in_stack_fffffffffffffc80);
      core::Txid::operator=((Txid *)&stack0xfffffffffffffc78,&local_280->txid);
      pvVar3 = std::
               vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
               operator[](&local_2c0,0);
      core::ConfidentialAssetId::operator=
                ((ConfidentialAssetId *)&stack0xfffffffffffffca0,&pvVar3->asset);
      pvVar3 = std::
               vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
               operator[](&local_2c0,0);
      core::ConfidentialValue::operator=(&local_338,&pvVar3->value);
      sVar4 = std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
              ::size(&local_2c0);
      if (1 < sVar4) {
        pvVar3 = std::
                 vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
                 operator[](&local_2c0,1);
        core::ConfidentialAssetId::operator=(&local_310,&pvVar3->asset);
        pvVar3 = std::
                 vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
                 operator[](&local_2c0,1);
        core::ConfidentialValue::operator=(&local_2e8,&pvVar3->value);
      }
      std::
      vector<cfd::api::UnblindIssuanceOutputs,_std::allocator<cfd::api::UnblindIssuanceOutputs>_>::
      push_back((vector<cfd::api::UnblindIssuanceOutputs,_std::allocator<cfd::api::UnblindIssuanceOutputs>_>
                 *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),__x);
      UnblindIssuanceOutputs::~UnblindIssuanceOutputs
                ((UnblindIssuanceOutputs *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
      ~vector((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
              CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
      __gnu_cxx::
      __normal_iterator<const_cfd::api::IssuanceBlindKeys_*,_std::vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_>_>
      ::operator++(&local_270);
    }
  }
  return (ConfidentialTransactionController *)this_00;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::UnblindTransaction(
    const std::string& tx_hex,
    const std::vector<TxOutUnblindKeys>& txout_unblind_keys,
    const std::vector<IssuanceBlindKeys>& issuance_blind_keys,
    std::vector<UnblindOutputs>* blind_outputs,
    std::vector<UnblindIssuanceOutputs>* issuance_outputs) {
  ConfidentialTransactionController ctxc(tx_hex);

  if (!txout_unblind_keys.empty() && blind_outputs != nullptr) {
    UnblindParameter unblind_param;
    for (const auto& txout : txout_unblind_keys) {
      // TxOutをUnblind
      const Privkey blinding_key(txout.blinding_key);
      unblind_param = ctxc.UnblindTxOut(txout.index, blinding_key);

      if (!unblind_param.asset.GetHex().empty()) {
        UnblindOutputs output;
        output.index = txout.index;
        output.blind_param.asset = unblind_param.asset;
        output.blind_param.vbf = unblind_param.vbf;
        output.blind_param.abf = unblind_param.abf;
        output.blind_param.value = unblind_param.value;
        blind_outputs->push_back(output);
      }
    }
  }

  if (!issuance_blind_keys.empty() && issuance_outputs != nullptr) {
    for (const auto& issuance : issuance_blind_keys) {
      uint32_t txin_index = ctxc.GetTransaction().GetTxInIndex(
          Txid(issuance.txid), issuance.vout);

      std::vector<UnblindParameter> issuance_param = ctxc.UnblindIssuance(
          txin_index, issuance.issuance_key.asset_key,
          issuance.issuance_key.token_key);

      UnblindIssuanceOutputs output;
      output.txid = issuance.txid;
      output.vout = issuance.vout;
      output.asset = issuance_param[0].asset;
      output.asset_amount = issuance_param[0].value;
      if (issuance_param.size() > 1) {
        output.token = issuance_param[1].asset;
        output.token_amount = issuance_param[1].value;
      }
      issuance_outputs->push_back(output);
    }
  }
  return ctxc;
}